

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::ClearBit(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32 uVar2;
  uint32 *puVar3;
  long in_RDI;
  uint32 index;
  FieldDescriptor *in_stack_ffffffffffffffd8;
  Reflection *in_stack_ffffffffffffffe0;
  
  bVar1 = internal::ReflectionSchema::HasHasbits((ReflectionSchema *)(in_RDI + 8));
  if (bVar1) {
    uVar2 = internal::ReflectionSchema::HasBitIndex
                      ((ReflectionSchema *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    puVar3 = MutableHasBits(in_stack_ffffffffffffffe0,(Message *)in_stack_ffffffffffffffd8);
    puVar3[uVar2 >> 5] = (1 << ((byte)uVar2 & 0x1f) ^ 0xffffffffU) & puVar3[uVar2 >> 5];
  }
  return;
}

Assistant:

void Reflection::ClearBit(Message* message,
                          const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!field->options().weak());
  if (!schema_.HasHasbits()) {
    return;
  }
  const uint32 index = schema_.HasBitIndex(field);
  MutableHasBits(message)[index / 32] &=
      ~(static_cast<uint32>(1) << (index % 32));
}